

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestExtensionOrderings1::Clear(TestExtensionOrderings1 *this)

{
  uint32_t *puVar1;
  uint32_t cached_has_bits;
  TestExtensionOrderings1 *this_local;
  
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
              (&(this->field_0)._impl_.my_string_);
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestExtensionOrderings1::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestExtensionOrderings1)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _impl_.my_string_.ClearNonDefaultToEmpty();
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}